

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O1

REF_STATUS ref_shard_prism_into_tet(REF_GRID ref_grid,REF_INT keeping_n_layers,REF_DICT of_faceid)

{
  int iVar1;
  int iVar2;
  REF_CELL pRVar3;
  REF_CELL pRVar4;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ pRVar5;
  bool bVar6;
  REF_STATUS RVar7;
  REF_BOOL RVar8;
  uint uVar9;
  REF_INT *vector;
  long lVar10;
  void *__ptr;
  long lVar11;
  undefined8 uVar12;
  int iVar13;
  char *pcVar14;
  int iVar15;
  REF_INT RVar16;
  REF_INT tri_mark;
  REF_INT tri_nodes [27];
  REF_INT orig [27];
  REF_INT qua_nodes [27];
  REF_GLOB qua_global [27];
  uint local_294;
  int local_274;
  REF_CELL local_270;
  REF_CELL local_268;
  REF_CELL local_260;
  int local_258;
  int iStack_254;
  int iStack_250;
  undefined4 local_24c;
  int local_1e8;
  int local_1e4;
  int iStack_1e0;
  int local_1dc;
  int local_1d8;
  int iStack_1d4;
  int local_178 [4];
  undefined4 local_168;
  long local_108 [27];
  
  pRVar3 = ref_grid->cell[10];
  pRVar4 = ref_grid->cell[8];
  local_260 = ref_grid->cell[9];
  local_270 = ref_grid->cell[6];
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  if ((long)ref_node->max < 0) {
    local_294 = 1;
    pcVar14 = "malloc mark of REF_INT negative";
LAB_00148f2a:
    bVar6 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x3a9,
           "ref_shard_prism_into_tet",pcVar14);
    vector = (REF_INT *)0x0;
  }
  else {
    vector = (REF_INT *)malloc((long)ref_node->max << 2);
    if (vector == (REF_INT *)0x0) {
      local_294 = 2;
      pcVar14 = "malloc mark of REF_INT NULL";
      goto LAB_00148f2a;
    }
    bVar6 = true;
    if (0 < ref_node->max) {
      lVar10 = 0;
      do {
        vector[lVar10] = -1;
        lVar10 = lVar10 + 1;
      } while (lVar10 < ref_node->max);
    }
  }
  if (!bVar6) {
    return local_294;
  }
  if ((long)ref_node->max < 0) {
    local_294 = 1;
    pcVar14 = "malloc mark_copy of REF_INT negative";
  }
  else {
    __ptr = malloc((long)ref_node->max << 2);
    if (__ptr != (void *)0x0) {
      bVar6 = true;
      if (0 < ref_node->max) {
        lVar10 = 0;
        do {
          *(undefined4 *)((long)__ptr + lVar10 * 4) = 0xffffffff;
          lVar10 = lVar10 + 1;
        } while (lVar10 < ref_node->max);
      }
      goto LAB_00148fe1;
    }
    local_294 = 2;
    pcVar14 = "malloc mark_copy of REF_INT NULL";
  }
  bVar6 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x3aa,
         "ref_shard_prism_into_tet",pcVar14);
  __ptr = (void *)0x0;
LAB_00148fe1:
  if (bVar6) {
    local_268 = pRVar4;
    if ((of_faceid != (REF_DICT)0x0 && 0 < keeping_n_layers) && (0 < pRVar3->max)) {
      RVar16 = 0;
      do {
        RVar7 = ref_cell_nodes(pRVar3,RVar16,&local_1e8);
        if (RVar7 == 0) {
          local_258 = local_1e8;
          iStack_254 = local_1e4;
          iStack_250 = iStack_1e0;
          uVar9 = ref_cell_with(ref_cell,&local_258,&local_274);
          if ((uVar9 != 0) && (uVar9 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x3b2,"ref_shard_prism_into_tet",(ulong)uVar9,"with");
            local_294 = uVar9;
          }
          if ((uVar9 != 5) && (uVar9 != 0)) {
            return local_294;
          }
          if (((long)local_274 != -1) &&
             (RVar8 = ref_dict_has_key(of_faceid,
                                       ref_cell->c2n[(long)ref_cell->size_per * (long)local_274 + 3]
                                      ), RVar8 != 0)) {
            vector[local_258] = 0;
            vector[iStack_254] = 0;
            vector[iStack_250] = 0;
          }
          local_258 = local_1dc;
          iStack_254 = iStack_1d4;
          iStack_250 = local_1d8;
          uVar9 = ref_cell_with(ref_cell,&local_258,&local_274);
          if ((uVar9 != 0) && (uVar9 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x3bd,"ref_shard_prism_into_tet",(ulong)uVar9,"with");
            local_294 = uVar9;
          }
          if ((uVar9 != 5) && (uVar9 != 0)) {
            return local_294;
          }
          if (((long)local_274 != -1) &&
             (RVar8 = ref_dict_has_key(of_faceid,
                                       ref_cell->c2n[(long)ref_cell->size_per * (long)local_274 + 3]
                                      ), RVar8 != 0)) {
            vector[local_258] = 0;
            vector[iStack_254] = 0;
            vector[iStack_250] = 0;
          }
        }
        RVar16 = RVar16 + 1;
      } while (RVar16 < pRVar3->max);
    }
    uVar9 = ref_node_ghost_int(ref_node,vector,1);
    if (uVar9 == 0) {
      if (0 < keeping_n_layers) {
        iVar15 = 0;
        do {
          if (0 < ref_node->max) {
            lVar10 = 0;
            do {
              *(REF_INT *)((long)__ptr + lVar10 * 4) = vector[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 < ref_node->max);
          }
          if (0 < pRVar3->max) {
            iVar13 = 0;
            do {
              RVar7 = ref_cell_nodes(pRVar3,iVar13,&local_1e8);
              if (RVar7 == 0) {
                iVar1 = *(int *)((long)__ptr + (long)local_1e8 * 4);
                if ((iVar1 == -1) &&
                   (iVar2 = *(int *)((long)__ptr + (long)local_1dc * 4), iVar2 != -1)) {
                  vector[local_1e8] = iVar2 + 1;
                }
                if ((iVar1 != -1) && (*(int *)((long)__ptr + (long)local_1dc * 4) == -1)) {
                  vector[local_1dc] = iVar1 + 1;
                }
                iVar1 = *(int *)((long)__ptr + (long)local_1e4 * 4);
                if ((iVar1 == -1) &&
                   (iVar2 = *(int *)((long)__ptr + (long)local_1d8 * 4), iVar2 != -1)) {
                  vector[local_1e4] = iVar2 + 1;
                }
                if ((iVar1 != -1) && (*(int *)((long)__ptr + (long)local_1d8 * 4) == -1)) {
                  vector[local_1d8] = iVar1 + 1;
                }
                iVar1 = *(int *)((long)__ptr + (long)iStack_1e0 * 4);
                if ((iVar1 == -1) &&
                   (iVar2 = *(int *)((long)__ptr + (long)iStack_1d4 * 4), iVar2 != -1)) {
                  vector[iStack_1e0] = iVar2 + 1;
                }
                if ((iVar1 != -1) && (*(int *)((long)__ptr + (long)iStack_1d4 * 4) == -1)) {
                  vector[iStack_1d4] = iVar1 + 1;
                }
              }
              iVar13 = iVar13 + 1;
            } while (iVar13 < pRVar3->max);
          }
          uVar9 = ref_node_ghost_int(ref_node,vector,1);
          if (uVar9 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x3db,"ref_shard_prism_into_tet",(ulong)uVar9,"update ghost mark");
            return uVar9;
          }
          iVar15 = iVar15 + 1;
        } while (iVar15 != keeping_n_layers);
      }
      if (0 < pRVar3->max) {
        iVar15 = 0;
        do {
          RVar7 = ref_cell_nodes(pRVar3,iVar15,&local_1e8);
          if ((RVar7 == 0) && ((vector[local_1e8] == -1 || (vector[local_1dc] == -1)))) {
            uVar9 = ref_cell_remove(pRVar3,iVar15);
            if (uVar9 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                     ,0x3e1,"ref_shard_prism_into_tet",(ulong)uVar9,"remove pri");
              return uVar9;
            }
            uVar9 = ref_shard_add_pri_as_tet(ref_node,local_268,&local_1e8,1);
            if (uVar9 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                     ,0x3e3,"ref_shard_prism_into_tet",(ulong)uVar9,"converts to tets");
              return uVar9;
            }
          }
          iVar15 = iVar15 + 1;
        } while (iVar15 < pRVar3->max);
      }
      if (0 < local_260->max) {
        RVar16 = 0;
        do {
          pRVar3 = local_260;
          RVar7 = ref_cell_nodes(local_260,RVar16,&local_1e8);
          if ((RVar7 == 0) &&
             ((((vector[local_1e8] == -1 || (vector[local_1e4] == -1)) || (vector[local_1dc] == -1))
              || (vector[local_1d8] == -1)))) {
            uVar9 = ref_cell_remove(pRVar3,RVar16);
            if (uVar9 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                     ,0x3eb,"ref_shard_prism_into_tet",(ulong)uVar9,"remove qua");
              return uVar9;
            }
            uVar9 = ref_shard_add_pyr_as_tet(ref_node,local_268,&local_1e8,1);
            if (uVar9 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                     ,0x3ed,"ref_shard_prism_into_tet",(ulong)uVar9,"converts to tets");
              return uVar9;
            }
          }
          RVar16 = RVar16 + 1;
        } while (RVar16 < local_260->max);
      }
      if (0 < local_270->max) {
        iVar15 = 0;
        do {
          RVar7 = ref_cell_nodes(local_270,iVar15,local_178);
          if ((RVar7 == 0) &&
             (((vector[local_178[0]] == -1 || (vector[local_178[1]] == -1)) ||
              ((vector[local_178[2]] == -1 || (vector[local_178[3]] == -1)))))) {
            uVar9 = ref_cell_remove(local_270,iVar15);
            if (uVar9 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                     ,0x3f5,"ref_shard_prism_into_tet",(ulong)uVar9,"remove qua");
              return uVar9;
            }
            local_24c = local_168;
            iVar13 = local_270->node_per;
            if (0 < (long)iVar13) {
              lVar10 = 0;
              do {
                iVar1 = local_178[lVar10];
                lVar11 = -1;
                if (((-1 < (long)iVar1) && (iVar1 < ref_node->max)) &&
                   (lVar11 = ref_node->global[iVar1], lVar11 < 0)) {
                  lVar11 = -1;
                }
                local_108[lVar10] = lVar11;
                lVar10 = lVar10 + 1;
              } while (iVar13 != lVar10);
            }
            if ((local_108[0] < local_108[1] && local_108[0] < local_108[3]) ||
               (local_108[2] < local_108[3] && local_108[2] < local_108[1])) {
              local_258 = local_178[0];
              uVar9 = ref_shard_cell_add_local(ref_node,ref_cell,&local_258);
              if (uVar9 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                       ,0x404,"ref_shard_prism_into_tet",(ulong)uVar9,"a tri");
                return uVar9;
              }
              local_258 = local_178[0];
              iStack_250 = local_178[2];
              uVar9 = ref_shard_cell_add_local(ref_node,ref_cell,&local_258);
              if (uVar9 != 0) {
                uVar12 = 0x408;
                goto LAB_001498e9;
              }
            }
            else {
              iStack_250 = local_178[3];
              uVar9 = ref_shard_cell_add_local(ref_node,ref_cell,&local_258);
              if (uVar9 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                       ,0x410,"ref_shard_prism_into_tet",(ulong)uVar9,"a tri");
                return uVar9;
              }
              local_258 = local_178[2];
              iStack_250 = local_178[1];
              uVar9 = ref_shard_cell_add_local(ref_node,ref_cell,&local_258);
              if (uVar9 != 0) {
                uVar12 = 0x414;
LAB_001498e9:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                       ,uVar12,"ref_shard_prism_into_tet",(ulong)uVar9,"a tri");
                local_294 = uVar9;
              }
            }
            if (uVar9 != 0) {
              return local_294;
            }
          }
          iVar15 = iVar15 + 1;
        } while (iVar15 < local_270->max);
      }
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      if (vector != (REF_INT *)0x0) {
        free(vector);
      }
      if (ref_node->max < 1) {
        local_294 = 0;
      }
      else {
        lVar10 = 0;
        do {
          if ((((-1 < ref_node->global[lVar10]) &&
               ((pRVar5 = ref_grid->cell[8]->ref_adj, pRVar5->nnode <= lVar10 ||
                (pRVar5->first[lVar10] == -1)))) &&
              ((pRVar5 = ref_grid->cell[9]->ref_adj, pRVar5->nnode <= lVar10 ||
               (pRVar5->first[lVar10] == -1)))) &&
             ((((pRVar5 = ref_grid->cell[10]->ref_adj, pRVar5->nnode <= lVar10 ||
                (pRVar5->first[lVar10] == -1)) &&
               ((pRVar5 = ref_grid->cell[0xb]->ref_adj, pRVar5->nnode <= lVar10 ||
                (pRVar5->first[lVar10] == -1)))) &&
              (uVar9 = ref_node_remove_without_global(ref_node,(REF_INT)lVar10), uVar9 != 0)))) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x420,"ref_shard_prism_into_tet",(ulong)uVar9,"hang node");
            return uVar9;
          }
          lVar10 = lVar10 + 1;
          local_294 = 0;
        } while (lVar10 < ref_node->max);
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x3c6
             ,"ref_shard_prism_into_tet",(ulong)uVar9,"update ghost mark");
      local_294 = uVar9;
    }
  }
  return local_294;
}

Assistant:

REF_FCN REF_STATUS ref_shard_prism_into_tet(REF_GRID ref_grid,
                                            REF_INT keeping_n_layers,
                                            REF_DICT of_faceid) {
  REF_INT cell, tri_mark;

  REF_INT orig[REF_CELL_MAX_SIZE_PER];
  REF_CELL pri = ref_grid_pri(ref_grid);
  REF_CELL pyr = ref_grid_pyr(ref_grid);
  REF_CELL tet = ref_grid_tet(ref_grid);

  REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT qua_nodes[REF_CELL_MAX_SIZE_PER];
  REF_GLOB qua_global[REF_CELL_MAX_SIZE_PER];
  REF_CELL qua = ref_grid_qua(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);

  REF_NODE ref_node = ref_grid_node(ref_grid);

  REF_INT relaxation;
  REF_INT node;
  REF_INT *mark, *mark_copy;

  ref_malloc_init(mark, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  ref_malloc_init(mark_copy, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  /* mark nodes on prism tris */
  if (0 < keeping_n_layers && NULL != of_faceid)
    each_ref_cell_valid_cell_with_nodes(pri, cell, orig) {
      tri_nodes[0] = orig[0];
      tri_nodes[1] = orig[1];
      tri_nodes[2] = orig[2];
      RXS(ref_cell_with(tri, tri_nodes, &tri_mark), REF_NOT_FOUND, "with");
      if (REF_EMPTY != tri_mark) {
        if (ref_dict_has_key(of_faceid, ref_cell_c2n(tri, 3, tri_mark))) {
          mark[tri_nodes[0]] = 0;
          mark[tri_nodes[1]] = 0;
          mark[tri_nodes[2]] = 0;
        }
      }
      tri_nodes[0] = orig[3];
      tri_nodes[1] = orig[5];
      tri_nodes[2] = orig[4];
      RXS(ref_cell_with(tri, tri_nodes, &tri_mark), REF_NOT_FOUND, "with");
      if (REF_EMPTY != tri_mark) {
        if (ref_dict_has_key(of_faceid, ref_cell_c2n(tri, 3, tri_mark))) {
          mark[tri_nodes[0]] = 0;
          mark[tri_nodes[1]] = 0;
          mark[tri_nodes[2]] = 0;
        }
      }
    }
  RSS(ref_node_ghost_int(ref_node, mark, 1), "update ghost mark");

  for (relaxation = 0; relaxation < keeping_n_layers; relaxation++) {
    for (node = 0; node < ref_node_max(ref_node); node++)
      mark_copy[node] = mark[node];
    each_ref_cell_valid_cell_with_nodes(pri, cell, orig) {
      if (mark_copy[orig[0]] == REF_EMPTY && mark_copy[orig[3]] != REF_EMPTY)
        mark[orig[0]] = mark_copy[orig[3]] + 1;
      if (mark_copy[orig[3]] == REF_EMPTY && mark_copy[orig[0]] != REF_EMPTY)
        mark[orig[3]] = mark_copy[orig[0]] + 1;

      if (mark_copy[orig[1]] == REF_EMPTY && mark_copy[orig[4]] != REF_EMPTY)
        mark[orig[1]] = mark_copy[orig[4]] + 1;
      if (mark_copy[orig[4]] == REF_EMPTY && mark_copy[orig[1]] != REF_EMPTY)
        mark[orig[4]] = mark_copy[orig[1]] + 1;

      if (mark_copy[orig[2]] == REF_EMPTY && mark_copy[orig[5]] != REF_EMPTY)
        mark[orig[2]] = mark_copy[orig[5]] + 1;
      if (mark_copy[orig[5]] == REF_EMPTY && mark_copy[orig[2]] != REF_EMPTY)
        mark[orig[5]] = mark_copy[orig[2]] + 1;
    }
    RSS(ref_node_ghost_int(ref_node, mark, 1), "update ghost mark");
  }

  each_ref_cell_valid_cell_with_nodes(pri, cell, orig) {
    if (mark[orig[0]] != REF_EMPTY && mark[orig[3]] != REF_EMPTY) continue;

    RSS(ref_cell_remove(pri, cell), "remove pri");
    RSS(ref_shard_add_pri_as_tet(ref_node, tet, orig, REF_TRUE),
        "converts to tets");
  }

  each_ref_cell_valid_cell_with_nodes(pyr, cell, orig) {
    if (mark[orig[0]] != REF_EMPTY && mark[orig[1]] != REF_EMPTY &&
        mark[orig[3]] != REF_EMPTY && mark[orig[4]] != REF_EMPTY)
      continue;

    RSS(ref_cell_remove(pyr, cell), "remove qua");
    RSS(ref_shard_add_pyr_as_tet(ref_node, tet, orig, REF_TRUE),
        "converts to tets");
  }

  each_ref_cell_valid_cell_with_nodes(qua, cell, qua_nodes) {
    if (mark[qua_nodes[0]] != REF_EMPTY && mark[qua_nodes[1]] != REF_EMPTY &&
        mark[qua_nodes[2]] != REF_EMPTY && mark[qua_nodes[3]] != REF_EMPTY)
      continue;

    RSS(ref_cell_remove(qua, cell), "remove qua");
    tri_nodes[3] = qua_nodes[4]; /* patch id */

    for (node = 0; node < ref_cell_node_per(qua); node++)
      qua_global[node] = ref_node_global(ref_node, qua_nodes[node]);

    if ((qua_global[0] < qua_global[1] && qua_global[0] < qua_global[3]) ||
        (qua_global[2] < qua_global[1] &&
         qua_global[2] < qua_global[3])) { /* 0-2 diag split of quad */
                                           /* 2-1
                                              |\|
                                              3-0 */
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[2];
      tri_nodes[2] = qua_nodes[3];
      RSS(ref_shard_cell_add_local(ref_node, tri, tri_nodes), "a tri");
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[1];
      tri_nodes[2] = qua_nodes[2];
      RSS(ref_shard_cell_add_local(ref_node, tri, tri_nodes), "a tri");
    } else { /* 3-1 diag split of quad */
             /* 2-1
                |/|
                3-0 */
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[1];
      tri_nodes[2] = qua_nodes[3];
      RSS(ref_shard_cell_add_local(ref_node, tri, tri_nodes), "a tri");
      tri_nodes[0] = qua_nodes[2];
      tri_nodes[1] = qua_nodes[3];
      tri_nodes[2] = qua_nodes[1];
      RSS(ref_shard_cell_add_local(ref_node, tri, tri_nodes), "a tri");
    }
  }

  ref_free(mark_copy);
  ref_free(mark);

  each_ref_node_valid_node(ref_node, node) {
    if (ref_adj_empty(ref_cell_adj(ref_grid_tet(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_pyr(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_pri(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_hex(ref_grid)), node)) {
      RSS(ref_node_remove_without_global(ref_node, node), "hang node");
    }
  }

  return REF_SUCCESS;
}